

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O2

int xercesc_4_0::XMLDateTime::compareResult
              (XMLDateTime *pDate1,XMLDateTime *pDate2,bool set2Left,int utc_type)

{
  int iVar1;
  undefined3 in_register_00000011;
  XMLDateTime *toCopy;
  XMLDateTime tmpDate;
  XMLDateTime local_90;
  
  toCopy = pDate2;
  if (CONCAT31(in_register_00000011,set2Left) != 0) {
    toCopy = pDate1;
  }
  XMLDateTime(&local_90,toCopy);
  local_90.fTimeZone[0] = 0xe;
  local_90.fTimeZone[1] = 0;
  local_90.fValue[7] = utc_type;
  normalize(&local_90);
  if (CONCAT31(in_register_00000011,set2Left) == 0) {
    iVar1 = compareOrder(pDate1,&local_90);
  }
  else {
    iVar1 = compareOrder(&local_90,pDate2);
  }
  ~XMLDateTime(&local_90);
  return iVar1;
}

Assistant:

int XMLDateTime::compareResult(const XMLDateTime* const pDate1
                             , const XMLDateTime* const pDate2
                             , bool  set2Left
                             , int   utc_type)
{
    XMLDateTime tmpDate = (set2Left ? *pDate1 : *pDate2);

    tmpDate.fTimeZone[hh] = 14;
    tmpDate.fTimeZone[mm] = 0;
    tmpDate.fValue[utc] = utc_type;
    tmpDate.normalize();

    return (set2Left? XMLDateTime::compareOrder(&tmpDate, pDate2) :
                      XMLDateTime::compareOrder(pDate1, &tmpDate));
}